

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O0

void __thiscall
pstore::repo::definition::definition
          (definition *this,digest d,extent<pstore::repo::fragment> x,
          typed_address<pstore::indirect_string> n,linkage l,visibility v)

{
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  initializer_list<pstore::repo::linkage> init;
  initializer_list<pstore::repo::visibility> init_00;
  _anonymous_namespace_ local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  _anonymous_namespace_ *local_68;
  undefined8 local_60;
  _anonymous_namespace_ local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  _anonymous_namespace_ *local_48;
  undefined8 local_40;
  definition *local_38;
  definition *this_local;
  typed_address<pstore::indirect_string> n_local;
  extent<pstore::repo::fragment> x_local;
  digest d_local;
  size_type extraout_RDX;
  
  init._M_len = x.size;
  this_local = (definition *)CONCAT71(in_register_00000089,v);
  *(address *)&(this->digest).v_ = x.addr.a_.a_.a_;
  *(uint64_t *)((long)&(this->digest).v_ + 8) = init._M_len;
  (this->fext).addr.a_.a_ = (value_type)n.a_.a_;
  (this->fext).size = CONCAT71(in_register_00000081,l);
  (this->name).a_.a_ = (value_type)this_local;
  (this->field_3).bf = '\0';
  this->padding1 = '\0';
  this->padding2 = 0;
  this->padding3 = 0;
  local_51 = (_anonymous_namespace_)0x0;
  local_50 = 1;
  local_4f = 2;
  local_4e = 3;
  local_4d = 4;
  local_4c = 5;
  local_4b = 6;
  local_4a = 7;
  local_49 = 8;
  local_48 = &local_51;
  local_40 = 9;
  init._M_array = (iterator)0x9;
  local_38 = this;
  n_local = n;
  (anonymous_namespace)::
  assert_enum_field_width<pstore::repo::linkage,pstore::bit_field<unsigned_char,0u,4u>>
            (local_48,init);
  local_6b = (_anonymous_namespace_)0x0;
  local_6a = 1;
  local_69 = 2;
  local_68 = &local_6b;
  local_60 = 3;
  init_00._M_len = extraout_RDX;
  init_00._M_array = (iterator)0x3;
  (anonymous_namespace)::
  assert_enum_field_width<pstore::repo::visibility,pstore::bit_field<unsigned_char,4u,2u>>
            (local_68,init_00);
  bit_field<unsigned_char,0u,4u>::operator=
            ((bit_field<unsigned_char,0u,4u> *)&(this->field_3).linkage_,(uchar)d.v_);
  bit_field<unsigned_char,4u,2u>::operator=
            ((bit_field<unsigned_char,4u,2u> *)&(this->field_3).linkage_,d.v_._8_1_);
  return;
}

Assistant:

definition::definition (pstore::index::digest const d, pstore::extent<fragment> const x,
                        pstore::typed_address<pstore::indirect_string> const n,
                        enum linkage const l, enum visibility const v) noexcept
        : digest{d}
        , fext{x}
        , name{n} {

    PSTORE_STATIC_ASSERT (std::is_standard_layout<definition>::value);
    PSTORE_STATIC_ASSERT (alignof (definition) == 16);
    PSTORE_STATIC_ASSERT (sizeof (definition) == 48);
    PSTORE_STATIC_ASSERT (offsetof (definition, digest) == 0);
    PSTORE_STATIC_ASSERT (offsetof (definition, fext) == 16);
    PSTORE_STATIC_ASSERT (offsetof (definition, name) == 32);
    PSTORE_STATIC_ASSERT (offsetof (definition, bf) == 40);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding1) == 41);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding2) == 42);
    PSTORE_STATIC_ASSERT (offsetof (definition, padding3) == 44);

#define X(a) repo::linkage::a,
    assert_enum_field_width<enum linkage, decltype (linkage_)> ({PSTORE_REPO_LINKAGES});
#undef X
#define X(a) repo::visibility::a,
    assert_enum_field_width<enum visibility, decltype (visibility_)> ({PSTORE_REPO_VISIBILITIES});
#undef X
    linkage_ = static_cast<std::underlying_type<enum linkage>::type> (l);
    visibility_ = static_cast<std::underlying_type<enum visibility>::type> (v);
}